

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

_Bool plutovg_matrix_parse(plutovg_matrix_t *matrix,char *data,int length)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *end_00;
  int count_5;
  int count_4;
  int count_3;
  int count_2;
  int count_1;
  plutovg_matrix_t m;
  int count;
  _Bool has_trailing_comma;
  char *end;
  char *it;
  float values [6];
  int local_24;
  int length_local;
  char *data_local;
  plutovg_matrix_t *matrix_local;
  
  plutovg_matrix_init_identity(matrix);
  local_24 = length;
  if (length == -1) {
    sVar3 = strlen(data);
    local_24 = (int)sVar3;
  }
  end_00 = data + local_24;
  m.f._3_1_ = 0;
  end = data;
  plutovg_skip_ws(&end,end_00);
  do {
    if (end_00 <= end) {
      return (_Bool)((m.f._3_1_ ^ 0xff) & 1);
    }
    _Var1 = plutovg_skip_string(&end,end_00,"matrix");
    if (_Var1) {
      m.e = (float)parse_matrix_parameters(&end,end_00,(float *)&it,6,0);
      if (m.e == 0.0) {
        return false;
      }
      count_2 = (int)it._0_4_;
      count_1 = (int)it._4_4_;
      m.a = values[0];
      m.b = values[1];
      m.c = values[2];
      m.d = values[3];
      plutovg_matrix_multiply(matrix,(plutovg_matrix_t *)&count_2,matrix);
    }
    else {
      _Var1 = plutovg_skip_string(&end,end_00,"translate");
      if (_Var1) {
        iVar2 = parse_matrix_parameters(&end,end_00,(float *)&it,1,1);
        if (iVar2 == 0) {
          return false;
        }
        if (iVar2 == 1) {
          plutovg_matrix_translate(matrix,it._0_4_,0.0);
        }
        else {
          plutovg_matrix_translate(matrix,it._0_4_,it._4_4_);
        }
      }
      else {
        _Var1 = plutovg_skip_string(&end,end_00,"scale");
        if (_Var1) {
          iVar2 = parse_matrix_parameters(&end,end_00,(float *)&it,1,1);
          if (iVar2 == 0) {
            return false;
          }
          if (iVar2 == 1) {
            plutovg_matrix_scale(matrix,it._0_4_,it._0_4_);
          }
          else {
            plutovg_matrix_scale(matrix,it._0_4_,it._4_4_);
          }
        }
        else {
          _Var1 = plutovg_skip_string(&end,end_00,"rotate");
          if (_Var1) {
            iVar2 = parse_matrix_parameters(&end,end_00,(float *)&it,1,2);
            if (iVar2 == 0) {
              return false;
            }
            if (iVar2 == 3) {
              plutovg_matrix_translate(matrix,it._4_4_,values[0]);
            }
            plutovg_matrix_rotate(matrix,it._0_4_ * 0.017453292);
            if (iVar2 == 3) {
              plutovg_matrix_translate(matrix,-it._4_4_,-values[0]);
            }
          }
          else {
            _Var1 = plutovg_skip_string(&end,end_00,"skewX");
            if (_Var1) {
              iVar2 = parse_matrix_parameters(&end,end_00,(float *)&it,1,0);
              if (iVar2 == 0) {
                return false;
              }
              plutovg_matrix_shear(matrix,it._0_4_ * 0.017453292,0.0);
            }
            else {
              _Var1 = plutovg_skip_string(&end,end_00,"skewY");
              if (!_Var1) {
                return false;
              }
              iVar2 = parse_matrix_parameters(&end,end_00,(float *)&it,1,0);
              if (iVar2 == 0) {
                return false;
              }
              plutovg_matrix_shear(matrix,0.0,it._0_4_ * 0.017453292);
            }
          }
        }
      }
    }
    plutovg_skip_ws_or_comma(&end,end_00,(_Bool *)((long)&m.f + 3));
  } while( true );
}

Assistant:

bool plutovg_matrix_parse(plutovg_matrix_t* matrix, const char* data, int length)
{
    float values[6];
    plutovg_matrix_init_identity(matrix);
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    bool has_trailing_comma = false;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(plutovg_skip_string(&it, end, "matrix")) {
            int count = parse_matrix_parameters(&it, end, values, 6, 0);
            if(count == 0)
                return false;
            plutovg_matrix_t m = { values[0], values[1], values[2], values[3], values[4], values[5] };
            plutovg_matrix_multiply(matrix, &m, matrix);
        } else if(plutovg_skip_string(&it, end, "translate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_translate(matrix, values[0], 0);
            } else {
                plutovg_matrix_translate(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "scale")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_scale(matrix, values[0], values[0]);
            } else {
                plutovg_matrix_scale(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "rotate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 2);
            if(count == 0)
                return false;
            if(count == 3)
                plutovg_matrix_translate(matrix, values[1], values[2]);
            plutovg_matrix_rotate(matrix, PLUTOVG_DEG2RAD(values[0]));
            if(count == 3) {
                plutovg_matrix_translate(matrix, -values[1], -values[2]);
            }
        } else if(plutovg_skip_string(&it, end, "skewX")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, PLUTOVG_DEG2RAD(values[0]), 0);
        } else if(plutovg_skip_string(&it, end, "skewY")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, 0, PLUTOVG_DEG2RAD(values[0]));
        } else {
            return false;
        }

        plutovg_skip_ws_or_comma(&it, end, &has_trailing_comma);
    }

    return !has_trailing_comma;
}